

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O0

void RandAddStaticEnv(CSHA512 *hasher)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  CSHA512 *hasher_00;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  char *exec_str;
  char *platform_str;
  uchar *random_aux;
  char *COMPILER_VERSION;
  ifaddrs *ifit;
  ifaddrs *ifad;
  utsname name;
  char hname [256];
  sockaddr *in_stack_fffffffffffffb80;
  CSHA512 *in_stack_fffffffffffffb88;
  uchar *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  __pid_t __pid;
  long local_368;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined *local_300;
  int *local_2f8;
  code *local_2f0;
  code *local_2e8;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c4;
  undefined8 local_2c0;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined1 local_28f;
  utsname local_28e;
  char local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28f = 1;
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(bool *)in_stack_fffffffffffffb80);
  local_298 = 8;
  (anonymous_namespace)::operator<<
            (in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  local_2a0 = 8;
  (anonymous_namespace)::operator<<
            (in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  local_2a8 = 4;
  (anonymous_namespace)::operator<<
            (in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  local_2ac = 4;
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80);
  local_2b0 = 2;
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80);
  local_2b4 = 1;
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80);
  local_2c0 = 0x31512;
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(long *)in_stack_fffffffffffffb80);
  local_2c4 = 700;
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80);
  strlen(
        "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80);
  local_2d0 = getauxval(0x10);
  (anonymous_namespace)::operator<<
            (in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  local_2d8 = getauxval(0x1a);
  (anonymous_namespace)::operator<<
            (in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  lVar2 = getauxval(0x19);
  if (lVar2 != 0) {
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  }
  pcVar3 = (char *)getauxval(0xf);
  if (pcVar3 != (char *)0x0) {
    strlen(pcVar3);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  }
  pcVar3 = (char *)getauxval(0x1f);
  if (pcVar3 != (char *)0x0) {
    strlen(pcVar3);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  }
  anon_unknown.dwarf_41c2c8::AddAllCPUID
            ((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(CSHA512 **)in_stack_fffffffffffffb80)
  ;
  local_2e8 = RandAddStaticEnv;
  (anonymous_namespace)::operator<<
            (in_stack_fffffffffffffb88,(_func_void_CSHA512_ptr **)in_stack_fffffffffffffb80);
  local_2f0 = malloc;
  (anonymous_namespace)::operator<<
            (in_stack_fffffffffffffb88,(_func_void_ptr_unsigned_long **)in_stack_fffffffffffffb80);
  local_2f8 = __errno_location();
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(int **)in_stack_fffffffffffffb80);
  local_300 = &environ;
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(char ****)in_stack_fffffffffffffb80);
  iVar1 = gethostname(local_108,0x100);
  if (iVar1 == 0) {
    strnlen(local_108,0x100);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  }
  local_308 = (undefined8 *)0x0;
  getifaddrs(&local_308);
  for (local_310 = local_308; local_310 != (undefined8 *)0x0; local_310 = (undefined8 *)*local_310)
  {
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    strlen((char *)local_310[1]);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    anon_unknown.dwarf_41c2c8::AddSockaddr(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    anon_unknown.dwarf_41c2c8::AddSockaddr(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    anon_unknown.dwarf_41c2c8::AddSockaddr(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  }
  freeifaddrs(local_308);
  iVar1 = uname(&local_28e);
  if (iVar1 != -1) {
    strlen(local_28e.sysname);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    strlen(local_28e.nodename);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    strlen(local_28e.release);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    strlen(local_28e.version);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    strlen(local_28e.machine);
    CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  }
  anon_unknown.dwarf_41c2c8::AddPath(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  anon_unknown.dwarf_41c2c8::AddPath(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  anon_unknown.dwarf_41c2c8::AddPath(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  anon_unknown.dwarf_41c2c8::AddPath(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  anon_unknown.dwarf_41c2c8::AddPath(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/proc/cmdline");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/proc/cpuinfo");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/proc/version");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/etc/passwd");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/etc/group");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/etc/hosts");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/etc/resolv.conf");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/etc/timezone");
  anon_unknown.dwarf_41c2c8::AddFile(in_RDI,"/etc/localtime");
  if (_environ != 0) {
    for (local_368 = 0; *(long *)(_environ + local_368 * 8) != 0; local_368 = local_368 + 1) {
      strlen(*(char **)(_environ + local_368 * 8));
      CSHA512::Write((CSHA512 *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
    }
  }
  getpid();
  hasher_00 = (anonymous_namespace)::operator<<(in_stack_fffffffffffffb88,(int *)in_RDI);
  getppid();
  (anonymous_namespace)::operator<<(hasher_00,(int *)in_RDI);
  __pid = 0;
  getsid(0);
  (anonymous_namespace)::operator<<(hasher_00,(int *)in_RDI);
  getpgid(__pid);
  (anonymous_namespace)::operator<<(hasher_00,(int *)in_RDI);
  getuid();
  (anonymous_namespace)::operator<<(hasher_00,(uint *)in_RDI);
  geteuid();
  (anonymous_namespace)::operator<<(hasher_00,(uint *)in_RDI);
  getgid();
  (anonymous_namespace)::operator<<(hasher_00,(uint *)in_RDI);
  getegid();
  (anonymous_namespace)::operator<<(hasher_00,(uint *)in_RDI);
  std::this_thread::get_id();
  (anonymous_namespace)::operator<<(hasher_00,(id *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RandAddStaticEnv(CSHA512& hasher)
{
    // Some compile-time static properties
    hasher << (CHAR_MIN < 0) << sizeof(void*) << sizeof(long) << sizeof(int);
#if defined(__GNUC__) && defined(__GNUC_MINOR__) && defined(__GNUC_PATCHLEVEL__)
    hasher << __GNUC__ << __GNUC_MINOR__ << __GNUC_PATCHLEVEL__;
#endif
#ifdef _MSC_VER
    hasher << _MSC_VER;
#endif
    hasher << __cplusplus;
#ifdef _XOPEN_VERSION
    hasher << _XOPEN_VERSION;
#endif
#ifdef __VERSION__
    const char* COMPILER_VERSION = __VERSION__;
    hasher.Write((const unsigned char*)COMPILER_VERSION, strlen(COMPILER_VERSION) + 1);
#endif

    // Bitcoin client version
    hasher << CLIENT_VERSION;

#if defined(HAVE_STRONG_GETAUXVAL)
    // Information available through getauxval()
#  ifdef AT_HWCAP
    hasher << getauxval(AT_HWCAP);
#  endif
#  ifdef AT_HWCAP2
    hasher << getauxval(AT_HWCAP2);
#  endif
#  ifdef AT_RANDOM
    const unsigned char* random_aux = (const unsigned char*)getauxval(AT_RANDOM);
    if (random_aux) hasher.Write(random_aux, 16);
#  endif
#  ifdef AT_PLATFORM
    const char* platform_str = (const char*)getauxval(AT_PLATFORM);
    if (platform_str) hasher.Write((const unsigned char*)platform_str, strlen(platform_str) + 1);
#  endif
#  ifdef AT_EXECFN
    const char* exec_str = (const char*)getauxval(AT_EXECFN);
    if (exec_str) hasher.Write((const unsigned char*)exec_str, strlen(exec_str) + 1);
#  endif
#endif // HAVE_STRONG_GETAUXVAL

#ifdef HAVE_GETCPUID
    AddAllCPUID(hasher);
#endif

    // Memory locations
    hasher << &hasher << &RandAddStaticEnv << &malloc << &errno << &environ;

    // Hostname
#ifdef WIN32
    constexpr DWORD max_size = MAX_COMPUTERNAME_LENGTH + 1;
    char hname[max_size];
    DWORD size = max_size;
    if (GetComputerNameA(hname, &size) != 0) {
        hasher.Write(UCharCast(hname), size);
    }
#else
    char hname[256];
    if (gethostname(hname, 256) == 0) {
        hasher.Write((const unsigned char*)hname, strnlen(hname, 256));
    }
#endif

#if HAVE_DECL_GETIFADDRS && HAVE_DECL_FREEIFADDRS
    // Network interfaces
    struct ifaddrs *ifad = nullptr;
    getifaddrs(&ifad);
    struct ifaddrs *ifit = ifad;
    while (ifit != nullptr) {
        hasher.Write((const unsigned char*)&ifit, sizeof(ifit));
        hasher.Write((const unsigned char*)ifit->ifa_name, strlen(ifit->ifa_name) + 1);
        hasher.Write((const unsigned char*)&ifit->ifa_flags, sizeof(ifit->ifa_flags));
        AddSockaddr(hasher, ifit->ifa_addr);
        AddSockaddr(hasher, ifit->ifa_netmask);
        AddSockaddr(hasher, ifit->ifa_dstaddr);
        ifit = ifit->ifa_next;
    }
    freeifaddrs(ifad);
#endif

#ifndef WIN32
    // UNIX kernel information
    struct utsname name;
    if (uname(&name) != -1) {
        hasher.Write((const unsigned char*)&name.sysname, strlen(name.sysname) + 1);
        hasher.Write((const unsigned char*)&name.nodename, strlen(name.nodename) + 1);
        hasher.Write((const unsigned char*)&name.release, strlen(name.release) + 1);
        hasher.Write((const unsigned char*)&name.version, strlen(name.version) + 1);
        hasher.Write((const unsigned char*)&name.machine, strlen(name.machine) + 1);
    }

    /* Path and filesystem provided data */
    AddPath(hasher, "/");
    AddPath(hasher, ".");
    AddPath(hasher, "/tmp");
    AddPath(hasher, "/home");
    AddPath(hasher, "/proc");
#ifdef __linux__
    AddFile(hasher, "/proc/cmdline");
    AddFile(hasher, "/proc/cpuinfo");
    AddFile(hasher, "/proc/version");
#endif
    AddFile(hasher, "/etc/passwd");
    AddFile(hasher, "/etc/group");
    AddFile(hasher, "/etc/hosts");
    AddFile(hasher, "/etc/resolv.conf");
    AddFile(hasher, "/etc/timezone");
    AddFile(hasher, "/etc/localtime");
#endif

    // For MacOS/BSDs, gather data through sysctl instead of /proc. Not all of these
    // will exist on every system.
#ifdef HAVE_SYSCTL
#  ifdef CTL_HW
#    ifdef HW_MACHINE
    AddSysctl<CTL_HW, HW_MACHINE>(hasher);
#    endif
#    ifdef HW_MODEL
    AddSysctl<CTL_HW, HW_MODEL>(hasher);
#    endif
#    ifdef HW_NCPU
    AddSysctl<CTL_HW, HW_NCPU>(hasher);
#    endif
#    ifdef HW_PHYSMEM
    AddSysctl<CTL_HW, HW_PHYSMEM>(hasher);
#    endif
#    ifdef HW_USERMEM
    AddSysctl<CTL_HW, HW_USERMEM>(hasher);
#    endif
#    ifdef HW_MACHINE_ARCH
    AddSysctl<CTL_HW, HW_MACHINE_ARCH>(hasher);
#    endif
#    ifdef HW_REALMEM
    AddSysctl<CTL_HW, HW_REALMEM>(hasher);
#    endif
#    ifdef HW_CPU_FREQ
    AddSysctl<CTL_HW, HW_CPU_FREQ>(hasher);
#    endif
#    ifdef HW_BUS_FREQ
    AddSysctl<CTL_HW, HW_BUS_FREQ>(hasher);
#    endif
#    ifdef HW_CACHELINE
    AddSysctl<CTL_HW, HW_CACHELINE>(hasher);
#    endif
#  endif
#  ifdef CTL_KERN
#    ifdef KERN_BOOTFILE
     AddSysctl<CTL_KERN, KERN_BOOTFILE>(hasher);
#    endif
#    ifdef KERN_BOOTTIME
     AddSysctl<CTL_KERN, KERN_BOOTTIME>(hasher);
#    endif
#    ifdef KERN_CLOCKRATE
     AddSysctl<CTL_KERN, KERN_CLOCKRATE>(hasher);
#    endif
#    ifdef KERN_HOSTID
     AddSysctl<CTL_KERN, KERN_HOSTID>(hasher);
#    endif
#    ifdef KERN_HOSTUUID
     AddSysctl<CTL_KERN, KERN_HOSTUUID>(hasher);
#    endif
#    ifdef KERN_HOSTNAME
     AddSysctl<CTL_KERN, KERN_HOSTNAME>(hasher);
#    endif
#    ifdef KERN_OSRELDATE
     AddSysctl<CTL_KERN, KERN_OSRELDATE>(hasher);
#    endif
#    ifdef KERN_OSRELEASE
     AddSysctl<CTL_KERN, KERN_OSRELEASE>(hasher);
#    endif
#    ifdef KERN_OSREV
     AddSysctl<CTL_KERN, KERN_OSREV>(hasher);
#    endif
#    ifdef KERN_OSTYPE
     AddSysctl<CTL_KERN, KERN_OSTYPE>(hasher);
#    endif
#    ifdef KERN_POSIX1
     AddSysctl<CTL_KERN, KERN_OSREV>(hasher);
#    endif
#    ifdef KERN_VERSION
     AddSysctl<CTL_KERN, KERN_VERSION>(hasher);
#    endif
#  endif
#endif

    // Env variables
    if (environ) {
        for (size_t i = 0; environ[i]; ++i) {
            hasher.Write((const unsigned char*)environ[i], strlen(environ[i]));
        }
    }

    // Process, thread, user, session, group, ... ids.
#ifdef WIN32
    hasher << GetCurrentProcessId() << GetCurrentThreadId();
#else
    hasher << getpid() << getppid() << getsid(0) << getpgid(0) << getuid() << geteuid() << getgid() << getegid();
#endif
    hasher << std::this_thread::get_id();
}